

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emfile.c
# Opt level: O1

int main(void)

{
  int iVar1;
  long lVar2;
  int socks [1000];
  int local_fa8 [1000];
  
  lVar2 = 0;
  do {
    iVar1 = nn_socket(1,0x10);
    local_fa8[lVar2] = iVar1;
    if (iVar1 < 0) {
      iVar1 = nn_errno();
      if (iVar1 != 0x18) {
        main_cold_1();
      }
      goto LAB_001012c0;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 1000);
  lVar2 = 1000;
LAB_001012c0:
  do {
    lVar2 = lVar2 + -1;
    if (lVar2 == -1) {
      return 0;
    }
    iVar1 = nn_close(local_fa8[lVar2]);
  } while (iVar1 == 0);
  main_cold_2();
  return 0;
}

Assistant:

int main ()
{
    int rc;
    int i;
    int socks [MAX_SOCKETS];

    /*  First, just create as much SP sockets as possible. */
    for (i = 0; i != MAX_SOCKETS; ++i) {
        socks [i] = nn_socket (AF_SP, NN_PAIR);
        if (socks [i] < 0) {
            errno_assert (nn_errno () == EMFILE);
            break;
        }
    }
    while (1) {
        --i;
        if (i == -1)
            break;
        rc = nn_close (socks [i]);
        errno_assert (rc == 0);
    }

    return 0;
}